

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O1

void OPENSSL_sk_delete_if
               (OPENSSL_STACK *sk,OPENSSL_sk_call_delete_if_func call_func,
               OPENSSL_sk_delete_if_func func,void *data)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    if (sk->num == 0) {
      sVar3 = 0;
    }
    else {
      uVar2 = 0;
      sVar3 = 0;
      do {
        iVar1 = (*call_func)(func,sk->data[uVar2],data);
        if (iVar1 == 0) {
          sk->data[sVar3] = sk->data[uVar2];
          sVar3 = sVar3 + 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < sk->num);
    }
    sk->num = sVar3;
  }
  return;
}

Assistant:

void OPENSSL_sk_delete_if(OPENSSL_STACK *sk,
                          OPENSSL_sk_call_delete_if_func call_func,
                          OPENSSL_sk_delete_if_func func, void *data) {
  if (sk == NULL) {
    return;
  }

  size_t new_num = 0;
  for (size_t i = 0; i < sk->num; i++) {
    if (!call_func(func, sk->data[i], data)) {
      sk->data[new_num] = sk->data[i];
      new_num++;
    }
  }
  sk->num = new_num;
}